

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewCharRef(xmlDocPtr doc,xmlChar *name)

{
  int len_00;
  xmlChar *pxVar1;
  xmlRegisterNodeFunc *pp_Var2;
  int len;
  xmlNodePtr cur;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  if (name == (xmlChar *)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    doc_local = (xmlDocPtr)(*xmlMalloc)(0x78);
    if (doc_local == (xmlDocPtr)0x0) {
      xmlTreeErrMemory("building character reference");
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      memset(doc_local,0,0x78);
      doc_local->type = XML_ENTITY_REF_NODE;
      doc_local->doc = doc;
      if (*name == '&') {
        pxVar1 = name + 1;
        len_00 = xmlStrlen(pxVar1);
        if (pxVar1[len_00 + -1] == ';') {
          pxVar1 = xmlStrndup(pxVar1,len_00 + -1);
          doc_local->name = (char *)pxVar1;
        }
        else {
          pxVar1 = xmlStrndup(pxVar1,len_00);
          doc_local->name = (char *)pxVar1;
        }
      }
      else {
        pxVar1 = xmlStrdup(name);
        doc_local->name = (char *)pxVar1;
      }
      if ((__xmlRegisterCallbacks != 0) &&
         (pp_Var2 = __xmlRegisterNodeDefaultValue(), *pp_Var2 != (xmlRegisterNodeFunc)0x0)) {
        pp_Var2 = __xmlRegisterNodeDefaultValue();
        (**pp_Var2)((xmlNodePtr)doc_local);
      }
    }
  }
  return (xmlNodePtr)doc_local;
}

Assistant:

xmlNodePtr
xmlNewCharRef(xmlDocPtr doc, const xmlChar *name) {
    xmlNodePtr cur;

    if (name == NULL)
        return(NULL);

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL) {
	xmlTreeErrMemory("building character reference");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_ENTITY_REF_NODE;

    cur->doc = doc;
    if (name[0] == '&') {
        int len;
        name++;
	len = xmlStrlen(name);
	if (name[len - 1] == ';')
	    cur->name = xmlStrndup(name, len - 1);
	else
	    cur->name = xmlStrndup(name, len);
    } else
	cur->name = xmlStrdup(name);

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);
    return(cur);
}